

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O2

void __thiscall qpdf::Tokenizer::inGt(Tokenizer *this,char ch)

{
  if (ch == '>') {
    this->type = tt_dict_close;
  }
  else {
    this->type = tt_bad;
    std::__cxx11::string::assign((char *)&this->error_message);
    this->in_token = false;
    this->char_to_unread = ch;
  }
  this->state = st_token_ready;
  return;
}

Assistant:

void
Tokenizer::inGt(char ch)
{
    if (ch == '>') {
        type = tt::tt_dict_close;
        state = st_token_ready;
    } else {
        type = tt::tt_bad;
        QTC::TC("qpdf", "QPDFTokenizer bad >");
        error_message = "unexpected >";
        in_token = false;
        char_to_unread = ch;
        state = st_token_ready;
    }
}